

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void add_linear_comb_weighted<double,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *res,double *Xc,
               int *Xc_ind,int *Xc_indptr,double *coef,double x_sd,double x_mean,double *fill_val,
               MissingAction missing_action,double *buffer_arr,size_t *buffer_NAs,bool first_run,
               vector<double,_std::allocator<double>_> *w)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  uint uVar1;
  int iVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  reference pvVar3;
  reference pvVar4;
  iterator buffer_arr_00;
  iterator fill_val_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var5;
  iterator st_00;
  iterator end_00;
  iterator col_num_00;
  iterator res_00;
  reference pvVar6;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  size_t *buffer_NAs_00;
  double *coef_00;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  double *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  int in_stack_00000028;
  byte in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  size_t ix_1;
  double currw;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  double mid_point;
  double cumw;
  size_t ix;
  size_t end_new;
  size_t row;
  vector<double,_std::allocator<double>_> obs_weight;
  vector<double,_std::allocator<double>_> denseX;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffde8;
  double *in_stack_fffffffffffffdf0;
  value_type vVar7;
  size_t in_stack_fffffffffffffdf8;
  value_type vVar8;
  size_t in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe08;
  size_t *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  byte local_1c9;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 *puVar9;
  undefined1 first_run_00;
  double in_stack_fffffffffffffe98;
  double x_mean_00;
  double in_stack_fffffffffffffea0;
  double x_sd_00;
  double *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *Xc_00;
  double *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  size_t *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  MissingAction in_stack_ffffffffffffff00;
  MissingAction missing_action_00;
  double *in_stack_ffffffffffffff08;
  size_t *in_stack_ffffffffffffff10;
  ulong local_e8;
  double local_e0;
  ulong local_d8;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_99;
  undefined8 local_98;
  vector<double,_std::allocator<double>_> local_90;
  byte local_71;
  double local_70;
  double local_68;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_71 = in_stack_00000040 & 1;
  if ((local_71 == 0) || (in_stack_00000028 == 0)) {
    add_linear_comb<double,int>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (int *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffee8,
               in_stack_fffffffffffffef0,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff10,SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
  }
  else {
    local_98 = 0;
    puVar9 = &local_99;
    local_70 = in_XMM1_Qa;
    local_68 = in_XMM0_Qa;
    local_48 = in_RDX;
    local_40 = in_RSI;
    local_38 = in_RDI;
    std::allocator<double>::allocator((allocator<double> *)0x25dcce);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0._M_current,
               (allocator_type *)in_stack_fffffffffffffdb8._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x25dd02);
    this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x25dd7f);
    todense<double,int>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    std::allocator<double>::allocator((allocator<double> *)0x25ddfe);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (allocator_type *)in_stack_fffffffffffffdc0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x25de2a);
    for (local_d8 = local_40; local_d8 <= local_48; local_d8 = local_d8 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000048,*(size_type *)(local_38 + local_d8 * 8));
      vVar8 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_c8,local_d8 - local_40);
      *pvVar3 = vVar8;
    }
    local_e0 = (double)((local_48 - local_40) + 1);
    for (local_e8 = 0; local_e8 < (local_48 - local_40) + 1; local_e8 = local_e8 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
      uVar1 = std::isnan(*pvVar3);
      local_1c9 = 1;
      if ((uVar1 & 1) == 0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
        iVar2 = std::isinf(*pvVar3);
        local_1c9 = (byte)iVar2;
      }
      if ((local_1c9 & 1) != 0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_e8);
        local_e0 = (double)((long)local_e0 - 1);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_90,(size_type)local_e0);
        std::swap<double>(pvVar3,pvVar4);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,local_e8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_c8,(size_type)local_e0);
        std::swap<double>(pvVar3,pvVar4);
      }
    }
    buffer_arr_00 = std::vector<double,_std::allocator<double>_>::begin(in_stack_00000010);
    fill_val_00 = std::vector<double,_std::allocator<double>_>::begin(in_stack_00000010);
    _Var5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffdb8._M_current,(difference_type)this);
    buffer_NAs_00 =
         (size_t *)
         std::
         accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                   (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(double)this);
    coef_00 = (double *)((double)buffer_NAs_00 * 0.5);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x25e122);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffdd0._M_current,
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (allocator_type *)in_stack_fffffffffffffdc0._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x25e148);
    st_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000010);
    end_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000010);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffdc0._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffdb8._M_current,(unsigned_long)this);
    col_num_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_00000010);
    res_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000010);
    Xc_00 = &local_90;
    __last._M_current._4_4_ = in_stack_fffffffffffffdcc;
    __last._M_current._0_4_ = in_stack_fffffffffffffdc8;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,add_linear_comb_weighted<double,int,std::vector<double,std::allocator<double>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,double_const*,int_const*,int_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>
              (in_stack_fffffffffffffdd0,__last,
               (anon_class_8_1_518b9257)in_stack_fffffffffffffdc0._M_current);
    x_sd_00 = 0.0;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(this);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar6);
    (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)*pvVar3;
    x_mean_00 = 0.0;
    while( true ) {
      missing_action_00 = (MissingAction)_Var5._M_current;
      first_run_00 = (undefined1)((ulong)puVar9 >> 0x38);
      if ((ulong)local_e0 <= (ulong)x_mean_00) break;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &stack0xfffffffffffffed8,(size_type)x_mean_00);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,*pvVar6);
      missing_action_00 = (MissingAction)_Var5._M_current;
      first_run_00 = (undefined1)((ulong)puVar9 >> 0x38);
      x_sd_00 = *pvVar3 + x_sd_00;
      if ((double)coef_00 <= x_sd_00) {
        if (((x_sd_00 != (double)coef_00) || (NAN(x_sd_00) || NAN((double)coef_00))) ||
           ((long)local_e0 - 1U <= (ulong)x_mean_00)) {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffed8,(size_type)x_mean_00);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar6);
          (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)*pvVar3;
        }
        else {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffed8,(size_type)x_mean_00);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar6);
          vVar8 = *pvVar3;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffed8,(long)x_mean_00 + 1);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar6);
          vVar7 = *pvVar3;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &stack0xfffffffffffffed8,(size_type)x_mean_00);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,*pvVar6);
          (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)(vVar8 + (vVar7 - *pvVar3) / 2.0);
        }
        break;
      }
      x_mean_00 = (double)((long)x_mean_00 + 1);
    }
    (in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((double)(in_stack_00000020->super__Vector_base<double,_std::allocator<double>_>)
                            ._M_impl.super__Vector_impl_data._M_start - local_70) *
                  (*in_stack_00000018 / local_68));
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x25e466);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x25e473);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x25e480);
    add_linear_comb<double,int>
              (in_stack_fffffffffffffed0,(size_t)st_00._M_current,(size_t)end_00._M_current,
               (size_t)col_num_00._M_current,(double *)res_00._M_current,(double *)Xc_00,
               (int *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffee8,coef_00,x_sd_00,
               x_mean_00,fill_val_00._M_current,missing_action_00,buffer_arr_00._M_current,
               buffer_NAs_00,(bool)first_run_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000020);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000020);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000020);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t *restrict ix_arr, size_t st, size_t end, size_t col_num, double *restrict res,
                              const real_t_ *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                              double &restrict coef, double x_sd, double x_mean, double &restrict fill_val, MissingAction missing_action,
                              double *restrict buffer_arr, size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: there's likely a better way of doing this directly with sparse inputs.
       Think about some way of doing it efficiently. */
    if (first_run && missing_action != Fail)
    {
        std::vector<double> denseX(end-st+1, 0.);
        todense(ix_arr, st, end,
                col_num, Xc, Xc_ind, Xc_indptr,
                denseX.data());
        std::vector<double> obs_weight(end-st+1);
        for (size_t row = st; row <= end; row++)
            obs_weight[row - st] = w[ix_arr[row]];

        size_t end_new = end - st + 1;
        for (size_t ix = 0; ix < end-st+1; ix++)
        {
            if (unlikely(is_na_or_inf(denseX[ix])))
            {
                std::swap(denseX[ix], denseX[--end_new]);
                std::swap(obs_weight[ix], obs_weight[end_new]);
            }
        }

        ldouble_safe cumw = std::accumulate(obs_weight.begin(), obs_weight.begin() + end_new, (ldouble_safe)0);
        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(end_new);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&denseX](const size_t a, const size_t b){return denseX[a] < denseX[b];});
        ldouble_safe currw = 0;
        fill_val = denseX[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < end_new; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < end_new-1)
                    fill_val = denseX[sorted_ix[ix]] + (denseX[sorted_ix[ix+1]] - denseX[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = denseX[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * (coef / x_sd);
        denseX.clear();
        obs_weight.clear();
        sorted_ix.clear();
        
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, false);
    }

    else
    {
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, first_run);
    }
}